

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_state.c
# Opt level: O0

void run_scheduling_stack_fcn(__cilkrts_worker *w)

{
  code *pcVar1;
  long lVar2;
  undefined8 uVar3;
  long in_RDI;
  __cilkrts_stack_frame *sf2;
  full_frame *ff2;
  scheduling_stack_fcn_t fcn;
  
  pcVar1 = *(code **)(*(long *)(in_RDI + 0x38) + 0x118);
  lVar2 = *(long *)(*(long *)(in_RDI + 0x38) + 0x30);
  uVar3 = *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x120);
  *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x118) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x120) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x30) = 0;
  if (pcVar1 == (code *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/local_state.c"
                  ,0x46,"fcn");
  }
  if (lVar2 != 0) {
    (*pcVar1)(in_RDI,lVar2,uVar3);
    if (*(long *)(*(long *)(in_RDI + 0x38) + 0x30) == 0) {
      return;
    }
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/local_state.c"
                  ,0x4c,"NULL == w->l->frame_ff");
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/local_state.c"
                ,0x47,"ff2");
}

Assistant:

void run_scheduling_stack_fcn(__cilkrts_worker *w)
{
    scheduling_stack_fcn_t fcn = w->l->post_suspend;
    full_frame *ff2 = w->l->frame_ff;
    __cilkrts_stack_frame *sf2 = w->l->suspended_stack;

    w->l->post_suspend = 0;
    w->l->suspended_stack = 0;

    // Conceptually, after clearing w->l->frame_ff,
    // w no longer owns the full frame ff.
    // The next time another (possibly different) worker takes
    // ownership of ff will be at a provably_good_steal on ff. 
    w->l->frame_ff = NULL;

    CILK_ASSERT(fcn);
    CILK_ASSERT(ff2);
    fcn(w, ff2, sf2);

    // After we run the scheduling stack function, we shouldn't
    // (still) not have a full frame.
    CILK_ASSERT(NULL == w->l->frame_ff);
}